

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-log.c
# Opt level: O3

void borg_prt_binary(uint32_t flags,wchar_t row,wchar_t col)

{
  wchar_t c;
  wchar_t a;
  int iVar1;
  uint32_t bitmask;
  uint uVar2;
  
  uVar2 = 1;
  iVar1 = 0;
  do {
    if ((uVar2 & flags) == 0) {
      a = L'\x01';
      c = L'-';
    }
    else {
      a = L'\x06';
      c = L'*';
    }
    Term_putch(col + iVar1,row,a,c);
    uVar2 = uVar2 * 2;
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0x20);
  return;
}

Assistant:

static void borg_prt_binary(uint32_t flags, int row, int col)
{
    int      i;
    uint32_t bitmask;

    /* Scan the flags */
    for (i = bitmask = 1; i <= 32; i++, bitmask *= 2) {
        /* Dump set bits */
        if (flags & bitmask) {
            Term_putch(col++, row, COLOUR_BLUE, '*');
        }

        /* Dump unset bits */
        else {
            Term_putch(col++, row, COLOUR_WHITE, '-');
        }
    }
}